

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiDockNode *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  ImGuiContext *ctx;
  char *pcVar6;
  bool *pbVar7;
  bool bVar8;
  char cVar9;
  ImU32 id;
  int iVar10;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar11;
  size_t sVar12;
  char *pcVar13;
  ImS8 IVar14;
  int iVar15;
  long lVar16;
  ImGuiTabItem *pIVar17;
  int iVar18;
  ImGuiCol idx;
  uint uVar19;
  ImGuiWindow *pIVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  bool is_contents_visible;
  float fVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 IVar30;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_88;
  ImGuiWindow *local_78;
  ImVec2 local_6c;
  uint local_64;
  ImVec2 local_60;
  char *local_58;
  ImVec2 local_50;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  bool *local_38;
  
  pIVar20 = docked_window;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  local_78 = GImGui->CurrentWindow;
  if (local_78->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    is_contents_visible = false;
LAB_001b8e77:
    local_88.Max.x = 0.0;
    local_88.Max.y = 0.0;
    local_88.Min.x = 0.0;
    local_88.Min.y = 0.0;
    ItemAdd(&local_88,id,(ImRect *)0x0);
    PopItemFlag();
    return is_contents_visible;
  }
  local_38 = (bool *)0x0;
  uVar22 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar22 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar22 = flags;
  }
  IVar5 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  fVar24 = IVar5.x;
  local_88.Max.y = IVar5.y;
  uVar19 = (tab_bar->Tabs).Size;
  uVar25 = extraout_XMM0_Dc;
  uVar26 = extraout_XMM0_Dd;
  if (0 < (int)uVar19 && id != 0) {
    pIVar11 = (tab_bar->Tabs).Data;
    lVar16 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar11->ID + lVar16) == id) {
        pIVar17 = (ImGuiTabItem *)((long)&pIVar11->ID + lVar16);
        uVar21 = 0;
        goto LAB_001b8cf4;
      }
      lVar16 = lVar16 + 0x28;
    } while ((ulong)uVar19 * 0x28 != lVar16);
  }
  if (uVar19 == (tab_bar->Tabs).Capacity) {
    uStack_40 = extraout_XMM0_Dc;
    local_48._0_4_ = IVar5.x;
    local_48._4_4_ = IVar5.y;
    uStack_3c = extraout_XMM0_Dd;
    if (uVar19 == 0) {
      iVar15 = 8;
    }
    else {
      iVar15 = (int)uVar19 / 2 + uVar19;
    }
    iVar23 = uVar19 + 1;
    if ((int)(uVar19 + 1) < iVar15) {
      iVar23 = iVar15;
    }
    pIVar11 = (ImGuiTabItem *)MemAlloc((long)iVar23 * 0x28);
    pIVar17 = (tab_bar->Tabs).Data;
    if (pIVar17 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar11,pIVar17,(long)(tab_bar->Tabs).Size * 0x28);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar11;
    (tab_bar->Tabs).Capacity = iVar23;
    uVar19 = (tab_bar->Tabs).Size;
    fVar24 = (float)local_48._0_4_;
    local_88.Max.y = (float)local_48._4_4_;
    uVar25 = uStack_40;
    uVar26 = uStack_3c;
  }
  else {
    pIVar11 = (tab_bar->Tabs).Data;
  }
  pIVar17 = pIVar11 + (int)uVar19;
  pIVar17->ID = 0;
  pIVar17->Flags = 0;
  pIVar17->Window = (ImGuiWindow *)0x0;
  pIVar11[(int)uVar19].LastFrameVisible = -1;
  pIVar11[(int)uVar19].LastFrameSelected = -1;
  pIVar11[(int)uVar19].NameOffset = -1;
  pIVar11[(int)uVar19].Offset = 0.0;
  pIVar11[(int)uVar19].Width = 0.0;
  pIVar11[(int)uVar19].ContentWidth = 0.0;
  iVar15 = (tab_bar->Tabs).Size;
  uVar19 = iVar15 + 1;
  (tab_bar->Tabs).Size = uVar19;
  if (iVar15 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                  ,0x639,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar11 = (tab_bar->Tabs).Data;
  pIVar17 = pIVar11 + ((ulong)uVar19 - 1);
  pIVar17->ID = id;
  pIVar11[(ulong)uVar19 - 1].Width = fVar24;
  uVar21 = CONCAT71((int7)((ulong)pIVar20 >> 8),1);
LAB_001b8cf4:
  local_58 = label;
  if ((pIVar17 < pIVar11) || (pIVar11 + (int)uVar19 <= pIVar17)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                  ,0x650,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar17 - (int)pIVar11) >> 3) * -0x3333;
  pIVar17->ContentWidth = fVar24;
  iVar15 = tab_bar->PrevFrameVisible;
  local_64 = tab_bar->Flags;
  iVar23 = ctx->FrameCount;
  iVar18 = pIVar17->LastFrameVisible;
  pIVar17->LastFrameVisible = iVar23;
  pIVar17->Flags = uVar22;
  pIVar17->Window = docked_window;
  if ((local_64 >> 0x14 & 1) == 0) {
    local_60.x = (float)(int)uVar21;
    local_48._4_4_ = local_88.Max.y;
    local_48._0_4_ = fVar24;
    uStack_40 = uVar25;
    uStack_3c = uVar26;
    if (docked_window != (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c42,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    iVar3 = (tab_bar->TabsNames).Buf.Size;
    iVar10 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar10 = 0;
    }
    pIVar17->NameOffset = iVar10;
    sVar12 = strlen(label);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar12 + 1);
    uVar21 = (ulong)local_60 & 0xffffffff;
    local_88.Max.y = (float)local_48._4_4_;
  }
  else {
    if (docked_window == (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c3d,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar17->NameOffset = -1;
  }
  iVar15 = iVar15 + 1;
  iVar18 = iVar18 + 1;
  uVar19 = tab_bar->Flags;
  if (iVar18 < iVar23) {
    if ((((uVar19 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar23 <= iVar15 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar19 & 1) == 0) {
    fVar24 = tab_bar->OffsetNextTab;
    pIVar17->Offset = fVar24;
    tab_bar->OffsetNextTab = pIVar17->Width + (ctx->Style).ItemInnerSpacing.x + fVar24;
  }
  if (((uVar22 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else {
    is_contents_visible = false;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) &&
       (iVar15 < iVar23)) {
      if ((tab_bar->Tabs).Size == 1) {
        is_contents_visible = (uVar19 & 2) == 0;
      }
      else {
        is_contents_visible = false;
      }
    }
  }
  if ((iVar18 < iVar23) && ((char)uVar21 != '\0' || iVar23 <= iVar15)) {
    PushItemFlag(0x18,true);
    goto LAB_001b8e77;
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar17->LastFrameSelected = ctx->FrameCount;
  }
  local_60 = (local_78->DC).CursorPos;
  local_88.Max.x = pIVar17->Width;
  IVar5 = (tab_bar->BarRect).Min;
  IVar30.x = (float)(int)(pIVar17->Offset - tab_bar->ScrollingAnim) + IVar5.x;
  IVar30.y = IVar5.y + 0.0;
  (local_78->DC).CursorPos = IVar30;
  local_88.Max.x = local_88.Max.x + IVar30.x;
  local_88.Max.y = local_88.Max.y + IVar30.y;
  fVar24 = (tab_bar->BarRect).Min.x;
  fVar1 = (tab_bar->BarRect).Max.x;
  uVar19 = -(uint)(IVar30.x < fVar24 || fVar1 < local_88.Max.x);
  local_48._0_4_ = uVar19;
  local_88.Min.x = IVar30.x;
  local_88.Min.y = IVar30.y;
  if ((uVar19 & 1) != 0) {
    local_50.y = IVar30.y + -1.0;
    local_50.x = (float)(~-(uint)(fVar24 <= IVar30.x) & (uint)fVar24 |
                        -(uint)(fVar24 <= IVar30.x) & (uint)IVar30.x);
    local_6c.x = fVar1;
    local_6c.y = local_88.Max.y;
    PushClipRect(&local_50,&local_6c,true);
  }
  pIVar20 = local_78;
  IVar5 = (local_78->DC).CursorMaxPos;
  local_50.y = local_88.Max.y - local_88.Min.y;
  local_50.x = local_88.Max.x - local_88.Min.x;
  ItemSize(&local_50,(ctx->Style).FramePadding.y);
  (pIVar20->DC).CursorMaxPos = IVar5;
  bVar8 = ItemAdd(&local_88,id,(ImRect *)0x0);
  pbVar7 = local_38;
  if (!bVar8) {
    if ((_local_48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PopClipRect();
    }
    (local_78->DC).CursorPos = local_60;
    return is_contents_visible;
  }
  uVar19 = 0x102;
  if (ctx->DragDropActive == true) {
    if ((ctx->DragDropPayload).DataFrameCount == -1) {
      uVar19 = 0x142;
    }
    else {
      iVar15 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType);
      uVar19 = (uint)(iVar15 != 0) << 6 | 0x102;
    }
  }
  bVar8 = ButtonBehavior(&local_88,id,(bool *)&local_50,(bool *)&local_6c,uVar19);
  if (bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  local_50.x._0_1_ = local_50.x._0_1_ | ctx->HoveredId == id;
  if (((docked_window != (ImGuiWindow *)0x0 && local_6c.x._0_1_ == '\x01') && (ctx->ActiveId == id))
     && (ctx->ActiveIdIsJustActivated == true)) {
    ctx->ActiveIdWindow = docked_window;
  }
  if (local_6c.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if (((((docked_window != (ImGuiWindow *)0x0) &&
        (pIVar4 = docked_window->DockNode, pIVar4 != (ImGuiDockNode *)0x0)) &&
       (pIVar4->ParentNode == (ImGuiDockNode *)0x0)) &&
      (((pIVar4->LocalFlags & 0x400U) == 0 && (local_6c.x._0_1_ == '\x01')))) &&
     (((pIVar4->Windows).Size == 1 && (bVar8 = IsMouseDragging(0,0.0), bVar8)))) {
    StartMouseMovingWindow(docked_window);
    goto LAB_001b9305;
  }
  if (((local_6c.x._0_1_ != '\x01') || (iVar18 < iVar23)) ||
     (bVar8 = IsMouseDragging(0,-1.0), !bVar8)) goto LAB_001b9305;
  bVar8 = ctx->DragDropActive;
  fVar24 = 0.0;
  if (bVar8 != false) goto LAB_001b9172;
  uVar19 = tab_bar->Flags;
  if (docked_window == (ImGuiWindow *)0x0 && (uVar19 & 1) == 0) goto LAB_001b9305;
  fVar1 = (ctx->IO).MouseDelta.x;
  if ((0.0 <= fVar1) || (fVar2 = (ctx->IO).MousePos.x, local_88.Min.x <= fVar2)) {
    if ((0.0 < fVar1) &&
       ((fVar1 = (ctx->IO).MousePos.x, local_88.Max.x < fVar1 &&
        (fVar24 = fVar1 - local_88.Max.x, (uVar19 & 1) != 0)))) {
      IVar14 = '\x01';
      goto LAB_001b9534;
    }
  }
  else {
    fVar24 = local_88.Min.x - fVar2;
    if ((uVar19 & 1) != 0) {
      IVar14 = -1;
LAB_001b9534:
      if (tab_bar->ReorderRequestTabId != 0) {
        __assert_fail("tab_bar->ReorderRequestTabId == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                      ,0x1b71,
                      "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                     );
      }
      tab_bar->ReorderRequestTabId = pIVar17->ID;
      tab_bar->ReorderRequestDir = IVar14;
    }
  }
LAB_001b9172:
  if ((docked_window == (ImGuiWindow *)0x0) || ((docked_window->Flags & 4) != 0)) goto LAB_001b9305;
  if ((bVar8 == false) || ((ctx->DragDropPayload).SourceId != id)) {
    fVar1 = ctx->FontSize;
    fVar27 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar1 + fVar1)) * 0.2;
    fVar2 = fVar1 * 4.0;
    if (fVar27 <= fVar1 * 4.0) {
      fVar2 = fVar27;
    }
    fVar29 = (ctx->IO).MousePos.y;
    fVar28 = local_88.Min.y - fVar29;
    fVar29 = fVar29 - local_88.Max.y;
    uVar19 = -(uint)(fVar29 <= fVar28);
    if ((float)(~uVar19 & (uint)fVar29 | (uint)fVar28 & uVar19) <
        fVar1 * 1.5 + (float)(~-(uint)(fVar27 < 0.0) & (uint)fVar2)) {
      if (fVar24 <= fVar1 * 2.2) goto LAB_001b9305;
      cVar9 = tab_bar->ReorderRequestDir;
      if (cVar9 < '\0') {
        iVar15 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar17);
        if (iVar15 == 0) goto LAB_001b926a;
        cVar9 = tab_bar->ReorderRequestDir;
      }
      if ((cVar9 < '\x01') ||
         (iVar15 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar17), iVar15 != (tab_bar->Tabs).Size + -1))
      goto LAB_001b9305;
    }
  }
LAB_001b926a:
  DockContextQueueUndockWindow(ctx,docked_window);
  ctx->MovingWindow = docked_window;
  ctx->ActiveId = docked_window->MoveId;
  IVar5.y = (ctx->ActiveIdClickOffset).y - ((docked_window->Pos).y - local_88.Min.y);
  IVar5.x = (ctx->ActiveIdClickOffset).x - ((docked_window->Pos).x - local_88.Min.x);
  ctx->ActiveIdClickOffset = IVar5;
LAB_001b9305:
  draw_list = local_78->DrawList;
  idx = 0x22;
  if ((local_6c.x._0_1_ == '\0') && (local_50.x._0_1_ == '\0')) {
    if (is_contents_visible == false) {
      idx = (uint)((local_64 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_64 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_88,uVar22,col);
  RenderNavHighlight((ImGui *)&local_88,(ImRect *)(ulong)id,1,col);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar22 = (uint)tab_bar->Flags >> 1 & 4 | uVar22;
  if (pbVar7 == (bool *)0x0) {
    TabItemLabelAndCloseButton
              (draw_list,&local_88,uVar22,tab_bar->FramePadding,local_58,id,0,is_contents_visible);
  }
  else {
    close_button_id = ImGuiWindow::GetID(local_78,(void *)((ulong)id + 1));
    bVar8 = TabItemLabelAndCloseButton
                      (draw_list,&local_88,uVar22,tab_bar->FramePadding,local_58,id,close_button_id,
                       is_contents_visible);
    if (bVar8) {
      *pbVar7 = false;
      if (tab_bar->VisibleTabId == pIVar17->ID) {
        if ((pIVar17->Flags & 1U) == 0) {
          pIVar17->LastFrameVisible = -1;
          tab_bar->SelectedTabId = 0;
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else if ((pIVar17->Flags & 1U) != 0) {
        tab_bar->NextSelectedTabId = pIVar17->ID;
      }
    }
  }
  if ((_local_48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    PopClipRect();
  }
  (local_78->DC).CursorPos = local_60;
  if (ctx->HoveredId != id) {
    return is_contents_visible;
  }
  if (local_6c.x._0_1_ != '\0') {
    return is_contents_visible;
  }
  if (ctx->HoveredIdNotActiveTimer <= 0.5) {
    return is_contents_visible;
  }
  bVar8 = IsItemHovered(0);
  pcVar6 = local_58;
  if (!bVar8) {
    return is_contents_visible;
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return is_contents_visible;
  }
  if ((pIVar17->Flags & 0x10) != 0) {
    return is_contents_visible;
  }
  pcVar13 = FindRenderedTextEnd(local_58,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)pcVar6),pcVar6);
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}